

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cc
# Opt level: O2

Object * xt::vector::nth(Object *__return_storage_ptr__,Vector *v,uint i,Object *notFound)

{
  __shared_ptr<xt::_Vector,_(__gnu_cxx::_Lock_policy)2> _Stack_28;
  
  if (i < ((v->super___shared_ptr<xt::_Vector,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->cnt) {
    std::__shared_ptr<xt::_Vector,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&_Stack_28,&v->super___shared_ptr<xt::_Vector,_(__gnu_cxx::_Lock_policy)2>);
    nth(__return_storage_ptr__,(Vector *)&_Stack_28,i);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_28._M_refcount);
  }
  else {
    Object::Object(__return_storage_ptr__,notFound);
  }
  return __return_storage_ptr__;
}

Assistant:

Object nth(Vector v, unsigned int i, Object notFound) {
	if (i < v->cnt) return nth(v, i);
	return notFound;
}